

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_inter_pred_filters_ssse3_intr.c
# Opt level: O1

void ihevc_inter_pred_luma_horz_ssse3
               (UWORD8 *pu1_src,UWORD8 *pu1_dst,WORD32 src_strd,WORD32 dst_strd,WORD8 *pi1_coeff,
               WORD32 ht,WORD32 wd)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  UWORD8 *pUVar12;
  int iVar13;
  UWORD8 *pUVar14;
  int iVar15;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar40 [16];
  undefined1 auVar49 [16];
  undefined1 auVar58 [16];
  undefined1 auVar63 [16];
  undefined1 auVar72 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar91 [16];
  undefined1 auVar100 [16];
  undefined1 auVar32 [16];
  undefined1 auVar41 [16];
  undefined1 auVar50 [16];
  undefined1 auVar64 [16];
  undefined1 auVar33 [16];
  undefined1 auVar42 [16];
  undefined1 auVar51 [16];
  undefined1 auVar65 [16];
  undefined1 auVar34 [16];
  undefined1 auVar43 [16];
  undefined1 auVar52 [16];
  undefined1 auVar66 [16];
  undefined1 auVar35 [16];
  undefined1 auVar44 [16];
  undefined1 auVar53 [16];
  undefined1 auVar67 [16];
  undefined1 auVar36 [16];
  undefined1 auVar45 [16];
  undefined1 auVar54 [16];
  undefined1 auVar59 [16];
  undefined1 auVar68 [16];
  undefined1 auVar37 [16];
  undefined1 auVar46 [16];
  undefined1 auVar55 [16];
  undefined1 auVar60 [16];
  undefined1 auVar69 [16];
  undefined1 auVar38 [16];
  undefined1 auVar47 [16];
  undefined1 auVar56 [16];
  undefined1 auVar61 [16];
  undefined1 auVar70 [16];
  undefined1 auVar39 [16];
  undefined1 auVar48 [16];
  undefined1 auVar57 [16];
  undefined1 auVar62 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar83 [16];
  undefined1 auVar92 [16];
  undefined1 auVar74 [16];
  undefined1 auVar84 [16];
  undefined1 auVar93 [16];
  undefined1 auVar75 [16];
  undefined1 auVar85 [16];
  undefined1 auVar94 [16];
  undefined1 auVar76 [16];
  undefined1 auVar86 [16];
  undefined1 auVar95 [16];
  undefined1 auVar77 [16];
  undefined1 auVar87 [16];
  undefined1 auVar96 [16];
  undefined1 auVar78 [16];
  undefined1 auVar88 [16];
  undefined1 auVar97 [16];
  undefined1 auVar79 [16];
  undefined1 auVar89 [16];
  undefined1 auVar98 [16];
  undefined1 auVar80 [16];
  undefined1 auVar90 [16];
  undefined1 auVar99 [16];
  
  auVar11 = _DAT_001717a0;
  auVar10 = _DAT_00171790;
  auVar9 = _DAT_00171780;
  if ((wd & 3U) != 0) {
    __assert_fail("(wd % 4 == 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/common/x86/ihevc_inter_pred_filters_ssse3_intr.c"
                  ,0x11a,
                  "void ihevc_inter_pred_luma_horz_ssse3(UWORD8 *, UWORD8 *, WORD32, WORD32, WORD8 *, WORD32, WORD32)"
                 );
  }
  iVar13 = src_strd * 2;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)pi1_coeff;
  auVar18 = pshuflw(in_XMM1,auVar17,0);
  auVar18._4_4_ = auVar18._0_4_;
  auVar18._8_4_ = auVar18._0_4_;
  auVar18._12_4_ = auVar18._0_4_;
  auVar19 = pshuflw(in_XMM2,auVar17,0x55);
  auVar19._4_4_ = auVar19._0_4_;
  auVar19._8_4_ = auVar19._0_4_;
  auVar19._12_4_ = auVar19._0_4_;
  auVar20 = pshuflw(in_XMM3,auVar17,0xaa);
  auVar20._4_4_ = auVar20._0_4_;
  auVar20._8_4_ = auVar20._0_4_;
  auVar20._12_4_ = auVar20._0_4_;
  auVar17 = pshufb(auVar17,_DAT_00171770);
  if ((ht & 1U) == 0) {
    if ((wd & 4U) == 0) {
      if (0 < ht) {
        pUVar12 = pu1_dst + dst_strd;
        pUVar14 = pu1_src + (long)src_strd + -3;
        iVar15 = 0;
        auVar21 = pmovsxbw(in_XMM7,0x2020202020202020);
        do {
          if (0 < wd) {
            lVar16 = 0;
            do {
              auVar26 = *(undefined1 (*) [16])(pu1_src + lVar16 + -3);
              auVar28 = *(undefined1 (*) [16])(pUVar14 + lVar16);
              auVar80._0_14_ = auVar26._0_14_;
              auVar80[0xe] = auVar26[7];
              auVar80[0xf] = auVar26[8];
              auVar79._14_2_ = auVar80._14_2_;
              auVar79._0_13_ = auVar26._0_13_;
              auVar79[0xd] = auVar26[7];
              auVar78._13_3_ = auVar79._13_3_;
              auVar78._0_12_ = auVar26._0_12_;
              auVar78[0xc] = auVar26[6];
              auVar77._12_4_ = auVar78._12_4_;
              auVar77._0_11_ = auVar26._0_11_;
              auVar77[0xb] = auVar26[6];
              auVar76._11_5_ = auVar77._11_5_;
              auVar76._0_10_ = auVar26._0_10_;
              auVar76[10] = auVar26[5];
              auVar75._10_6_ = auVar76._10_6_;
              auVar75._0_9_ = auVar26._0_9_;
              auVar75[9] = auVar26[5];
              auVar74._9_7_ = auVar75._9_7_;
              auVar74._0_8_ = auVar26._0_8_;
              auVar74[8] = auVar26[4];
              auVar73._8_8_ = auVar74._8_8_;
              auVar73[7] = auVar26[4];
              auVar73[6] = auVar26[3];
              auVar73[5] = auVar26[3];
              auVar73[4] = auVar26[2];
              auVar73[3] = auVar26[2];
              auVar72._0_2_ = auVar26._0_2_;
              auVar73[2] = auVar26[1];
              auVar73._0_2_ = auVar72._0_2_;
              auVar72._2_14_ = auVar73._2_14_;
              auVar81 = pmaddubsw(auVar72,auVar18);
              auVar30 = pshufb(auVar26,auVar9);
              auVar30 = pmaddubsw(auVar30,auVar19);
              auVar100 = pshufb(auVar26,auVar10);
              auVar100 = pmaddubsw(auVar100,auVar20);
              auVar26 = pshufb(auVar26,auVar11);
              auVar26 = pmaddubsw(auVar26,auVar17);
              auVar27._0_2_ = auVar26._0_2_ + auVar100._0_2_ + auVar30._0_2_ + auVar81._0_2_;
              auVar27._2_2_ = auVar26._2_2_ + auVar100._2_2_ + auVar30._2_2_ + auVar81._2_2_;
              auVar27._4_2_ = auVar26._4_2_ + auVar100._4_2_ + auVar30._4_2_ + auVar81._4_2_;
              auVar27._6_2_ = auVar26._6_2_ + auVar100._6_2_ + auVar30._6_2_ + auVar81._6_2_;
              auVar27._8_2_ = auVar26._8_2_ + auVar100._8_2_ + auVar30._8_2_ + auVar81._8_2_;
              auVar27._10_2_ = auVar26._10_2_ + auVar100._10_2_ + auVar30._10_2_ + auVar81._10_2_;
              auVar27._12_2_ = auVar26._12_2_ + auVar100._12_2_ + auVar30._12_2_ + auVar81._12_2_;
              auVar27._14_2_ = auVar26._14_2_ + auVar100._14_2_ + auVar30._14_2_ + auVar81._14_2_;
              auVar26 = paddsw(auVar27,auVar21);
              auVar26 = psraw(auVar26,6);
              sVar1 = auVar26._0_2_;
              sVar2 = auVar26._2_2_;
              sVar3 = auVar26._4_2_;
              sVar4 = auVar26._6_2_;
              sVar5 = auVar26._8_2_;
              sVar6 = auVar26._10_2_;
              sVar7 = auVar26._12_2_;
              sVar8 = auVar26._14_2_;
              *(ulong *)(pu1_dst + lVar16) =
                   CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar26[0xe] - (0xff < sVar8),
                            CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar26[0xc] - (0xff < sVar7),
                                     CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar26[10] -
                                              (0xff < sVar6),
                                              CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar26[8] -
                                                       (0xff < sVar5),
                                                       CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                                auVar26[6] - (0xff < sVar4),
                                                                CONCAT12((0 < sVar3) *
                                                                         (sVar3 < 0x100) *
                                                                         auVar26[4] - (0xff < sVar3)
                                                                         ,CONCAT11((0 < sVar2) *
                                                                                   (sVar2 < 0x100) *
                                                                                   auVar26[2] -
                                                                                   (0xff < sVar2),
                                                                                   (0 < sVar1) *
                                                                                   (sVar1 < 0x100) *
                                                                                   auVar26[0] -
                                                                                   (0xff < sVar1))))
                                                      ))));
              auVar39._0_14_ = auVar28._0_14_;
              auVar39[0xe] = auVar28[7];
              auVar39[0xf] = auVar28[8];
              auVar38._14_2_ = auVar39._14_2_;
              auVar38._0_13_ = auVar28._0_13_;
              auVar38[0xd] = auVar28[7];
              auVar37._13_3_ = auVar38._13_3_;
              auVar37._0_12_ = auVar28._0_12_;
              auVar37[0xc] = auVar28[6];
              auVar36._12_4_ = auVar37._12_4_;
              auVar36._0_11_ = auVar28._0_11_;
              auVar36[0xb] = auVar28[6];
              auVar35._11_5_ = auVar36._11_5_;
              auVar35._0_10_ = auVar28._0_10_;
              auVar35[10] = auVar28[5];
              auVar34._10_6_ = auVar35._10_6_;
              auVar34._0_9_ = auVar28._0_9_;
              auVar34[9] = auVar28[5];
              auVar33._9_7_ = auVar34._9_7_;
              auVar33._0_8_ = auVar28._0_8_;
              auVar33[8] = auVar28[4];
              auVar32._8_8_ = auVar33._8_8_;
              auVar32[7] = auVar28[4];
              auVar32[6] = auVar28[3];
              auVar32[5] = auVar28[3];
              auVar32[4] = auVar28[2];
              auVar32[3] = auVar28[2];
              auVar31._0_2_ = auVar28._0_2_;
              auVar32[2] = auVar28[1];
              auVar32._0_2_ = auVar31._0_2_;
              auVar31._2_14_ = auVar32._2_14_;
              auVar81 = pmaddubsw(auVar31,auVar18);
              auVar26 = pshufb(auVar28,auVar9);
              auVar30 = pmaddubsw(auVar26,auVar19);
              auVar26 = pshufb(auVar28,auVar10);
              auVar100 = pmaddubsw(auVar26,auVar20);
              auVar26 = pshufb(auVar28,auVar11);
              auVar26 = pmaddubsw(auVar26,auVar17);
              auVar22._0_2_ = auVar26._0_2_ + auVar100._0_2_ + auVar30._0_2_ + auVar81._0_2_;
              auVar22._2_2_ = auVar26._2_2_ + auVar100._2_2_ + auVar30._2_2_ + auVar81._2_2_;
              auVar22._4_2_ = auVar26._4_2_ + auVar100._4_2_ + auVar30._4_2_ + auVar81._4_2_;
              auVar22._6_2_ = auVar26._6_2_ + auVar100._6_2_ + auVar30._6_2_ + auVar81._6_2_;
              auVar22._8_2_ = auVar26._8_2_ + auVar100._8_2_ + auVar30._8_2_ + auVar81._8_2_;
              auVar22._10_2_ = auVar26._10_2_ + auVar100._10_2_ + auVar30._10_2_ + auVar81._10_2_;
              auVar22._12_2_ = auVar26._12_2_ + auVar100._12_2_ + auVar30._12_2_ + auVar81._12_2_;
              auVar22._14_2_ = auVar26._14_2_ + auVar100._14_2_ + auVar30._14_2_ + auVar81._14_2_;
              auVar26 = paddsw(auVar22,auVar21);
              auVar26 = psraw(auVar26,6);
              sVar1 = auVar26._0_2_;
              sVar2 = auVar26._2_2_;
              sVar3 = auVar26._4_2_;
              sVar4 = auVar26._6_2_;
              sVar5 = auVar26._8_2_;
              sVar6 = auVar26._10_2_;
              sVar7 = auVar26._12_2_;
              sVar8 = auVar26._14_2_;
              *(ulong *)(pUVar12 + lVar16) =
                   CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar26[0xe] - (0xff < sVar8),
                            CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar26[0xc] - (0xff < sVar7),
                                     CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar26[10] -
                                              (0xff < sVar6),
                                              CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar26[8] -
                                                       (0xff < sVar5),
                                                       CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                                auVar26[6] - (0xff < sVar4),
                                                                CONCAT12((0 < sVar3) *
                                                                         (sVar3 < 0x100) *
                                                                         auVar26[4] - (0xff < sVar3)
                                                                         ,CONCAT11((0 < sVar2) *
                                                                                   (sVar2 < 0x100) *
                                                                                   auVar26[2] -
                                                                                   (0xff < sVar2),
                                                                                   (0 < sVar1) *
                                                                                   (sVar1 < 0x100) *
                                                                                   auVar26[0] -
                                                                                   (0xff < sVar1))))
                                                      ))));
              lVar16 = lVar16 + 8;
            } while ((int)lVar16 < wd);
          }
          pu1_src = pu1_src + iVar13;
          pu1_dst = pu1_dst + dst_strd * 2;
          iVar15 = iVar15 + 2;
          pUVar12 = pUVar12 + dst_strd * 2;
          pUVar14 = pUVar14 + iVar13;
        } while (iVar15 < ht);
      }
    }
    else if (0 < ht) {
      pUVar14 = pu1_dst + dst_strd;
      pUVar12 = pu1_src + (long)src_strd + -3;
      iVar15 = 0;
      auVar21 = pmovsxbw(in_XMM7,0x2020202020202020);
      do {
        if (0 < wd) {
          lVar16 = 0;
          do {
            auVar26 = *(undefined1 (*) [16])(pu1_src + lVar16 + -3);
            auVar28 = *(undefined1 (*) [16])(pUVar12 + lVar16);
            auVar90._0_14_ = auVar26._0_14_;
            auVar90[0xe] = auVar26[7];
            auVar90[0xf] = auVar26[8];
            auVar89._14_2_ = auVar90._14_2_;
            auVar89._0_13_ = auVar26._0_13_;
            auVar89[0xd] = auVar26[7];
            auVar88._13_3_ = auVar89._13_3_;
            auVar88._0_12_ = auVar26._0_12_;
            auVar88[0xc] = auVar26[6];
            auVar87._12_4_ = auVar88._12_4_;
            auVar87._0_11_ = auVar26._0_11_;
            auVar87[0xb] = auVar26[6];
            auVar86._11_5_ = auVar87._11_5_;
            auVar86._0_10_ = auVar26._0_10_;
            auVar86[10] = auVar26[5];
            auVar85._10_6_ = auVar86._10_6_;
            auVar85._0_9_ = auVar26._0_9_;
            auVar85[9] = auVar26[5];
            auVar84._9_7_ = auVar85._9_7_;
            auVar84._0_8_ = auVar26._0_8_;
            auVar84[8] = auVar26[4];
            auVar83._8_8_ = auVar84._8_8_;
            auVar83[7] = auVar26[4];
            auVar83[6] = auVar26[3];
            auVar83[5] = auVar26[3];
            auVar83[4] = auVar26[2];
            auVar83[3] = auVar26[2];
            auVar82._0_2_ = auVar26._0_2_;
            auVar83[2] = auVar26[1];
            auVar83._0_2_ = auVar82._0_2_;
            auVar82._2_14_ = auVar83._2_14_;
            auVar81 = pmaddubsw(auVar82,auVar18);
            auVar30 = pshufb(auVar26,auVar9);
            auVar30 = pmaddubsw(auVar30,auVar19);
            auVar100 = pshufb(auVar26,auVar10);
            auVar100 = pmaddubsw(auVar100,auVar20);
            auVar26 = pshufb(auVar26,auVar11);
            auVar26 = pmaddubsw(auVar26,auVar17);
            auVar29._0_2_ = auVar26._0_2_ + auVar100._0_2_ + auVar30._0_2_ + auVar81._0_2_;
            auVar29._2_2_ = auVar26._2_2_ + auVar100._2_2_ + auVar30._2_2_ + auVar81._2_2_;
            auVar29._4_2_ = auVar26._4_2_ + auVar100._4_2_ + auVar30._4_2_ + auVar81._4_2_;
            auVar29._6_2_ = auVar26._6_2_ + auVar100._6_2_ + auVar30._6_2_ + auVar81._6_2_;
            auVar29._8_2_ = auVar26._8_2_ + auVar100._8_2_ + auVar30._8_2_ + auVar81._8_2_;
            auVar29._10_2_ = auVar26._10_2_ + auVar100._10_2_ + auVar30._10_2_ + auVar81._10_2_;
            auVar29._12_2_ = auVar26._12_2_ + auVar100._12_2_ + auVar30._12_2_ + auVar81._12_2_;
            auVar29._14_2_ = auVar26._14_2_ + auVar100._14_2_ + auVar30._14_2_ + auVar81._14_2_;
            auVar26 = paddsw(auVar29,auVar21);
            auVar26 = psraw(auVar26,6);
            sVar1 = auVar26._0_2_;
            sVar2 = auVar26._2_2_;
            sVar3 = auVar26._4_2_;
            sVar4 = auVar26._6_2_;
            *(ulong *)(pu1_dst + lVar16) =
                 *(ulong *)(pu1_dst + lVar16) & 0xffffffff00000000 |
                 (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar26[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar26[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar26[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar26[0] -
                                                   (0xff < sVar1))));
            auVar57._0_14_ = auVar28._0_14_;
            auVar57[0xe] = auVar28[7];
            auVar57[0xf] = auVar28[8];
            auVar56._14_2_ = auVar57._14_2_;
            auVar56._0_13_ = auVar28._0_13_;
            auVar56[0xd] = auVar28[7];
            auVar55._13_3_ = auVar56._13_3_;
            auVar55._0_12_ = auVar28._0_12_;
            auVar55[0xc] = auVar28[6];
            auVar54._12_4_ = auVar55._12_4_;
            auVar54._0_11_ = auVar28._0_11_;
            auVar54[0xb] = auVar28[6];
            auVar53._11_5_ = auVar54._11_5_;
            auVar53._0_10_ = auVar28._0_10_;
            auVar53[10] = auVar28[5];
            auVar52._10_6_ = auVar53._10_6_;
            auVar52._0_9_ = auVar28._0_9_;
            auVar52[9] = auVar28[5];
            auVar51._9_7_ = auVar52._9_7_;
            auVar51._0_8_ = auVar28._0_8_;
            auVar51[8] = auVar28[4];
            auVar50._8_8_ = auVar51._8_8_;
            auVar50[7] = auVar28[4];
            auVar50[6] = auVar28[3];
            auVar50[5] = auVar28[3];
            auVar50[4] = auVar28[2];
            auVar50[3] = auVar28[2];
            auVar49._0_2_ = auVar28._0_2_;
            auVar50[2] = auVar28[1];
            auVar50._0_2_ = auVar49._0_2_;
            auVar49._2_14_ = auVar50._2_14_;
            auVar81 = pmaddubsw(auVar49,auVar18);
            auVar26 = pshufb(auVar28,auVar9);
            auVar30 = pmaddubsw(auVar26,auVar19);
            auVar26 = pshufb(auVar28,auVar10);
            auVar100 = pmaddubsw(auVar26,auVar20);
            auVar26 = pshufb(auVar28,auVar11);
            auVar26 = pmaddubsw(auVar26,auVar17);
            auVar24._0_2_ = auVar26._0_2_ + auVar100._0_2_ + auVar30._0_2_ + auVar81._0_2_;
            auVar24._2_2_ = auVar26._2_2_ + auVar100._2_2_ + auVar30._2_2_ + auVar81._2_2_;
            auVar24._4_2_ = auVar26._4_2_ + auVar100._4_2_ + auVar30._4_2_ + auVar81._4_2_;
            auVar24._6_2_ = auVar26._6_2_ + auVar100._6_2_ + auVar30._6_2_ + auVar81._6_2_;
            auVar24._8_2_ = auVar26._8_2_ + auVar100._8_2_ + auVar30._8_2_ + auVar81._8_2_;
            auVar24._10_2_ = auVar26._10_2_ + auVar100._10_2_ + auVar30._10_2_ + auVar81._10_2_;
            auVar24._12_2_ = auVar26._12_2_ + auVar100._12_2_ + auVar30._12_2_ + auVar81._12_2_;
            auVar24._14_2_ = auVar26._14_2_ + auVar100._14_2_ + auVar30._14_2_ + auVar81._14_2_;
            auVar26 = paddsw(auVar24,auVar21);
            auVar26 = psraw(auVar26,6);
            sVar1 = auVar26._0_2_;
            sVar2 = auVar26._2_2_;
            sVar3 = auVar26._4_2_;
            sVar4 = auVar26._6_2_;
            *(ulong *)(pUVar14 + lVar16) =
                 *(ulong *)(pUVar14 + lVar16) & 0xffffffff00000000 |
                 (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar26[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar26[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar26[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar26[0] -
                                                   (0xff < sVar1))));
            lVar16 = lVar16 + 4;
          } while ((int)lVar16 < wd);
        }
        pu1_src = pu1_src + iVar13;
        pu1_dst = pu1_dst + dst_strd * 2;
        iVar15 = iVar15 + 2;
        pUVar14 = pUVar14 + dst_strd * 2;
        pUVar12 = pUVar12 + iVar13;
      } while (iVar15 < ht);
    }
  }
  else if ((wd & 4U) == 0) {
    if (0 < ht) {
      iVar13 = 0;
      auVar21 = pmovsxbw(in_XMM7,0x2020202020202020);
      do {
        if (0 < wd) {
          lVar16 = 0;
          do {
            auVar26 = *(undefined1 (*) [16])(pu1_src + lVar16 + -3);
            auVar48._0_14_ = auVar26._0_14_;
            auVar48[0xe] = auVar26[7];
            auVar48[0xf] = auVar26[8];
            auVar47._14_2_ = auVar48._14_2_;
            auVar47._0_13_ = auVar26._0_13_;
            auVar47[0xd] = auVar26[7];
            auVar46._13_3_ = auVar47._13_3_;
            auVar46._0_12_ = auVar26._0_12_;
            auVar46[0xc] = auVar26[6];
            auVar45._12_4_ = auVar46._12_4_;
            auVar45._0_11_ = auVar26._0_11_;
            auVar45[0xb] = auVar26[6];
            auVar44._11_5_ = auVar45._11_5_;
            auVar44._0_10_ = auVar26._0_10_;
            auVar44[10] = auVar26[5];
            auVar43._10_6_ = auVar44._10_6_;
            auVar43._0_9_ = auVar26._0_9_;
            auVar43[9] = auVar26[5];
            auVar42._9_7_ = auVar43._9_7_;
            auVar42._0_8_ = auVar26._0_8_;
            auVar42[8] = auVar26[4];
            auVar41._8_8_ = auVar42._8_8_;
            auVar41[7] = auVar26[4];
            auVar41[6] = auVar26[3];
            auVar41[5] = auVar26[3];
            auVar41[4] = auVar26[2];
            auVar41[3] = auVar26[2];
            auVar40._0_2_ = auVar26._0_2_;
            auVar41[2] = auVar26[1];
            auVar41._0_2_ = auVar40._0_2_;
            auVar40._2_14_ = auVar41._2_14_;
            auVar30 = pmaddubsw(auVar40,auVar18);
            auVar28 = pshufb(auVar26,auVar9);
            auVar28 = pmaddubsw(auVar28,auVar19);
            auVar81 = pshufb(auVar26,auVar10);
            auVar81 = pmaddubsw(auVar81,auVar20);
            auVar26 = pshufb(auVar26,auVar11);
            auVar26 = pmaddubsw(auVar26,auVar17);
            auVar23._0_2_ = auVar26._0_2_ + auVar81._0_2_ + auVar28._0_2_ + auVar30._0_2_;
            auVar23._2_2_ = auVar26._2_2_ + auVar81._2_2_ + auVar28._2_2_ + auVar30._2_2_;
            auVar23._4_2_ = auVar26._4_2_ + auVar81._4_2_ + auVar28._4_2_ + auVar30._4_2_;
            auVar23._6_2_ = auVar26._6_2_ + auVar81._6_2_ + auVar28._6_2_ + auVar30._6_2_;
            auVar23._8_2_ = auVar26._8_2_ + auVar81._8_2_ + auVar28._8_2_ + auVar30._8_2_;
            auVar23._10_2_ = auVar26._10_2_ + auVar81._10_2_ + auVar28._10_2_ + auVar30._10_2_;
            auVar23._12_2_ = auVar26._12_2_ + auVar81._12_2_ + auVar28._12_2_ + auVar30._12_2_;
            auVar23._14_2_ = auVar26._14_2_ + auVar81._14_2_ + auVar28._14_2_ + auVar30._14_2_;
            auVar26 = paddsw(auVar23,auVar21);
            auVar26 = psraw(auVar26,6);
            sVar1 = auVar26._0_2_;
            sVar2 = auVar26._2_2_;
            sVar3 = auVar26._4_2_;
            sVar4 = auVar26._6_2_;
            sVar5 = auVar26._8_2_;
            sVar6 = auVar26._10_2_;
            sVar7 = auVar26._12_2_;
            sVar8 = auVar26._14_2_;
            *(ulong *)(pu1_dst + lVar16) =
                 CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar26[0xe] - (0xff < sVar8),
                          CONCAT16((0 < sVar7) * (sVar7 < 0x100) * auVar26[0xc] - (0xff < sVar7),
                                   CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar26[10] -
                                            (0xff < sVar6),
                                            CONCAT14((0 < sVar5) * (sVar5 < 0x100) * auVar26[8] -
                                                     (0xff < sVar5),
                                                     CONCAT13((0 < sVar4) * (sVar4 < 0x100) *
                                                              auVar26[6] - (0xff < sVar4),
                                                              CONCAT12((0 < sVar3) * (sVar3 < 0x100)
                                                                       * auVar26[4] - (0xff < sVar3)
                                                                       ,CONCAT11((0 < sVar2) *
                                                                                 (sVar2 < 0x100) *
                                                                                 auVar26[2] -
                                                                                 (0xff < sVar2),
                                                                                 (0 < sVar1) *
                                                                                 (sVar1 < 0x100) *
                                                                                 auVar26[0] -
                                                                                 (0xff < sVar1))))))
                                  ));
            lVar16 = lVar16 + 8;
          } while ((int)lVar16 < wd);
        }
        pu1_src = pu1_src + src_strd;
        pu1_dst = pu1_dst + dst_strd;
        iVar13 = iVar13 + 1;
      } while (iVar13 != ht);
    }
  }
  else {
    if (1 < ht) {
      pUVar12 = pu1_dst + dst_strd;
      pUVar14 = pu1_src + (long)src_strd + -3;
      iVar15 = 0;
      in_XMM7 = pmovsxbw(in_XMM7,0x2020202020202020);
      do {
        if (0 < wd) {
          lVar16 = 0;
          do {
            auVar21 = *(undefined1 (*) [16])(pu1_src + lVar16 + -3);
            auVar26 = *(undefined1 (*) [16])(pUVar14 + lVar16);
            auVar99._0_14_ = auVar21._0_14_;
            auVar99[0xe] = auVar21[7];
            auVar99[0xf] = auVar21[8];
            auVar98._14_2_ = auVar99._14_2_;
            auVar98._0_13_ = auVar21._0_13_;
            auVar98[0xd] = auVar21[7];
            auVar97._13_3_ = auVar98._13_3_;
            auVar97._0_12_ = auVar21._0_12_;
            auVar97[0xc] = auVar21[6];
            auVar96._12_4_ = auVar97._12_4_;
            auVar96._0_11_ = auVar21._0_11_;
            auVar96[0xb] = auVar21[6];
            auVar95._11_5_ = auVar96._11_5_;
            auVar95._0_10_ = auVar21._0_10_;
            auVar95[10] = auVar21[5];
            auVar94._10_6_ = auVar95._10_6_;
            auVar94._0_9_ = auVar21._0_9_;
            auVar94[9] = auVar21[5];
            auVar93._9_7_ = auVar94._9_7_;
            auVar93._0_8_ = auVar21._0_8_;
            auVar93[8] = auVar21[4];
            auVar92._8_8_ = auVar93._8_8_;
            auVar92[7] = auVar21[4];
            auVar92[6] = auVar21[3];
            auVar92[5] = auVar21[3];
            auVar92[4] = auVar21[2];
            auVar92[3] = auVar21[2];
            auVar91._0_2_ = auVar21._0_2_;
            auVar92[2] = auVar21[1];
            auVar92._0_2_ = auVar91._0_2_;
            auVar91._2_14_ = auVar92._2_14_;
            auVar81 = pmaddubsw(auVar91,auVar18);
            auVar28 = pshufb(auVar21,auVar9);
            auVar30 = pmaddubsw(auVar28,auVar19);
            auVar28 = pshufb(auVar21,auVar10);
            auVar100 = pmaddubsw(auVar28,auVar20);
            auVar21 = pshufb(auVar21,auVar11);
            auVar21 = pmaddubsw(auVar21,auVar17);
            auVar28._0_2_ = auVar21._0_2_ + auVar100._0_2_ + auVar30._0_2_ + auVar81._0_2_;
            auVar28._2_2_ = auVar21._2_2_ + auVar100._2_2_ + auVar30._2_2_ + auVar81._2_2_;
            auVar28._4_2_ = auVar21._4_2_ + auVar100._4_2_ + auVar30._4_2_ + auVar81._4_2_;
            auVar28._6_2_ = auVar21._6_2_ + auVar100._6_2_ + auVar30._6_2_ + auVar81._6_2_;
            auVar28._8_2_ = auVar21._8_2_ + auVar100._8_2_ + auVar30._8_2_ + auVar81._8_2_;
            auVar28._10_2_ = auVar21._10_2_ + auVar100._10_2_ + auVar30._10_2_ + auVar81._10_2_;
            auVar28._12_2_ = auVar21._12_2_ + auVar100._12_2_ + auVar30._12_2_ + auVar81._12_2_;
            auVar28._14_2_ = auVar21._14_2_ + auVar100._14_2_ + auVar30._14_2_ + auVar81._14_2_;
            auVar21 = paddsw(auVar28,in_XMM7);
            auVar21 = psraw(auVar21,6);
            sVar1 = auVar21._0_2_;
            sVar2 = auVar21._2_2_;
            sVar3 = auVar21._4_2_;
            sVar4 = auVar21._6_2_;
            *(ulong *)(pu1_dst + lVar16) =
                 *(ulong *)(pu1_dst + lVar16) & 0xffffffff00000000 |
                 (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar21[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar21[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar21[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar21[0] -
                                                   (0xff < sVar1))));
            auVar62._0_14_ = auVar26._0_14_;
            auVar62[0xe] = auVar26[7];
            auVar62[0xf] = auVar26[8];
            auVar61._14_2_ = auVar62._14_2_;
            auVar61._0_13_ = auVar26._0_13_;
            auVar61[0xd] = auVar26[7];
            auVar60._13_3_ = auVar61._13_3_;
            auVar60._0_12_ = auVar26._0_12_;
            auVar60[0xc] = auVar26[6];
            auVar59._12_4_ = auVar60._12_4_;
            auVar59._0_11_ = auVar26._0_11_;
            auVar59[0xb] = auVar26[6];
            auVar81._11_5_ = auVar59._11_5_;
            auVar81._0_10_ = auVar26._0_10_;
            auVar81[10] = auVar26[5];
            auVar30._10_6_ = auVar81._10_6_;
            auVar30._0_9_ = auVar26._0_9_;
            auVar30[9] = auVar26[5];
            auVar100._9_7_ = auVar30._9_7_;
            auVar100._0_8_ = auVar26._0_8_;
            auVar100[8] = auVar26[4];
            auVar21._8_8_ = auVar100._8_8_;
            auVar21[7] = auVar26[4];
            auVar21[6] = auVar26[3];
            auVar21[5] = auVar26[3];
            auVar21[4] = auVar26[2];
            auVar21[3] = auVar26[2];
            auVar58._0_2_ = auVar26._0_2_;
            auVar21[2] = auVar26[1];
            auVar21._0_2_ = auVar58._0_2_;
            auVar58._2_14_ = auVar21._2_14_;
            auVar30 = pmaddubsw(auVar58,auVar18);
            auVar21 = pshufb(auVar26,auVar9);
            auVar28 = pmaddubsw(auVar21,auVar19);
            auVar21 = pshufb(auVar26,auVar10);
            auVar81 = pmaddubsw(auVar21,auVar20);
            auVar21 = pshufb(auVar26,auVar11);
            auVar21 = pmaddubsw(auVar21,auVar17);
            auVar26._0_2_ = auVar21._0_2_ + auVar81._0_2_ + auVar28._0_2_ + auVar30._0_2_;
            auVar26._2_2_ = auVar21._2_2_ + auVar81._2_2_ + auVar28._2_2_ + auVar30._2_2_;
            auVar26._4_2_ = auVar21._4_2_ + auVar81._4_2_ + auVar28._4_2_ + auVar30._4_2_;
            auVar26._6_2_ = auVar21._6_2_ + auVar81._6_2_ + auVar28._6_2_ + auVar30._6_2_;
            auVar26._8_2_ = auVar21._8_2_ + auVar81._8_2_ + auVar28._8_2_ + auVar30._8_2_;
            auVar26._10_2_ = auVar21._10_2_ + auVar81._10_2_ + auVar28._10_2_ + auVar30._10_2_;
            auVar26._12_2_ = auVar21._12_2_ + auVar81._12_2_ + auVar28._12_2_ + auVar30._12_2_;
            auVar26._14_2_ = auVar21._14_2_ + auVar81._14_2_ + auVar28._14_2_ + auVar30._14_2_;
            auVar21 = paddsw(auVar26,in_XMM7);
            auVar21 = psraw(auVar21,6);
            sVar1 = auVar21._0_2_;
            sVar2 = auVar21._2_2_;
            sVar3 = auVar21._4_2_;
            sVar4 = auVar21._6_2_;
            *(ulong *)(pUVar12 + lVar16) =
                 *(ulong *)(pUVar12 + lVar16) & 0xffffffff00000000 |
                 (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar21[6] - (0xff < sVar4),
                                 CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar21[4] -
                                          (0xff < sVar3),
                                          CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar21[2] -
                                                   (0xff < sVar2),
                                                   (0 < sVar1) * (sVar1 < 0x100) * auVar21[0] -
                                                   (0xff < sVar1))));
            lVar16 = lVar16 + 4;
          } while ((int)lVar16 < wd);
        }
        pu1_src = pu1_src + iVar13;
        pu1_dst = pu1_dst + dst_strd * 2;
        iVar15 = iVar15 + 2;
        pUVar12 = pUVar12 + dst_strd * 2;
        pUVar14 = pUVar14 + iVar13;
      } while (iVar15 < ht + -1);
    }
    auVar11 = _DAT_001717a0;
    auVar10 = _DAT_00171790;
    auVar9 = _DAT_00171780;
    if (0 < wd) {
      lVar16 = 0;
      auVar21 = pmovsxbw(in_XMM7,0x2020202020202020);
      do {
        auVar26 = *(undefined1 (*) [16])(pu1_src + lVar16 + -3);
        auVar71._0_14_ = auVar26._0_14_;
        auVar71[0xe] = auVar26[7];
        auVar71[0xf] = auVar26[8];
        auVar70._14_2_ = auVar71._14_2_;
        auVar70._0_13_ = auVar26._0_13_;
        auVar70[0xd] = auVar26[7];
        auVar69._13_3_ = auVar70._13_3_;
        auVar69._0_12_ = auVar26._0_12_;
        auVar69[0xc] = auVar26[6];
        auVar68._12_4_ = auVar69._12_4_;
        auVar68._0_11_ = auVar26._0_11_;
        auVar68[0xb] = auVar26[6];
        auVar67._11_5_ = auVar68._11_5_;
        auVar67._0_10_ = auVar26._0_10_;
        auVar67[10] = auVar26[5];
        auVar66._10_6_ = auVar67._10_6_;
        auVar66._0_9_ = auVar26._0_9_;
        auVar66[9] = auVar26[5];
        auVar65._9_7_ = auVar66._9_7_;
        auVar65._0_8_ = auVar26._0_8_;
        auVar65[8] = auVar26[4];
        auVar64._8_8_ = auVar65._8_8_;
        auVar64[7] = auVar26[4];
        auVar64[6] = auVar26[3];
        auVar64[5] = auVar26[3];
        auVar64[4] = auVar26[2];
        auVar64[3] = auVar26[2];
        auVar63._0_2_ = auVar26._0_2_;
        auVar64[2] = auVar26[1];
        auVar64._0_2_ = auVar63._0_2_;
        auVar63._2_14_ = auVar64._2_14_;
        auVar30 = pmaddubsw(auVar63,auVar18);
        auVar28 = pshufb(auVar26,auVar9);
        auVar28 = pmaddubsw(auVar28,auVar19);
        auVar81 = pshufb(auVar26,auVar10);
        auVar81 = pmaddubsw(auVar81,auVar20);
        auVar26 = pshufb(auVar26,auVar11);
        auVar26 = pmaddubsw(auVar26,auVar17);
        auVar25._0_2_ = auVar26._0_2_ + auVar81._0_2_ + auVar28._0_2_ + auVar30._0_2_;
        auVar25._2_2_ = auVar26._2_2_ + auVar81._2_2_ + auVar28._2_2_ + auVar30._2_2_;
        auVar25._4_2_ = auVar26._4_2_ + auVar81._4_2_ + auVar28._4_2_ + auVar30._4_2_;
        auVar25._6_2_ = auVar26._6_2_ + auVar81._6_2_ + auVar28._6_2_ + auVar30._6_2_;
        auVar25._8_2_ = auVar26._8_2_ + auVar81._8_2_ + auVar28._8_2_ + auVar30._8_2_;
        auVar25._10_2_ = auVar26._10_2_ + auVar81._10_2_ + auVar28._10_2_ + auVar30._10_2_;
        auVar25._12_2_ = auVar26._12_2_ + auVar81._12_2_ + auVar28._12_2_ + auVar30._12_2_;
        auVar25._14_2_ = auVar26._14_2_ + auVar81._14_2_ + auVar28._14_2_ + auVar30._14_2_;
        auVar26 = paddsw(auVar25,auVar21);
        auVar26 = psraw(auVar26,6);
        sVar1 = auVar26._0_2_;
        sVar2 = auVar26._2_2_;
        sVar3 = auVar26._4_2_;
        sVar4 = auVar26._6_2_;
        *(ulong *)(pu1_dst + lVar16) =
             *(ulong *)(pu1_dst + lVar16) & 0xffffffff00000000 |
             (ulong)CONCAT13((0 < sVar4) * (sVar4 < 0x100) * auVar26[6] - (0xff < sVar4),
                             CONCAT12((0 < sVar3) * (sVar3 < 0x100) * auVar26[4] - (0xff < sVar3),
                                      CONCAT11((0 < sVar2) * (sVar2 < 0x100) * auVar26[2] -
                                               (0xff < sVar2),
                                               (0 < sVar1) * (sVar1 < 0x100) * auVar26[0] -
                                               (0xff < sVar1))));
        lVar16 = lVar16 + 4;
      } while ((int)lVar16 < wd);
    }
  }
  return;
}

Assistant:

void ihevc_inter_pred_luma_horz_ssse3(UWORD8 *pu1_src,
                                      UWORD8 *pu1_dst,
                                      WORD32 src_strd,
                                      WORD32 dst_strd,
                                      WORD8 *pi1_coeff,
                                      WORD32 ht,
                                      WORD32 wd)
{
    WORD32 row, col;

    /* all 128 bit registers are named with a suffix mxnb, where m is the */
    /* number of n bits packed in the register                            */
    __m128i zero_8x16b, offset_8x16b, mask_low_32b, mask_high_96b;
    __m128i src_temp1_16x8b, src_temp2_16x8b, src_temp3_16x8b, src_temp4_16x8b, src_temp5_16x8b, src_temp6_16x8b;
    __m128i src_temp11_16x8b, src_temp12_16x8b, src_temp13_16x8b, src_temp14_16x8b, src_temp15_16x8b, src_temp16_16x8b;
    __m128i res_temp1_8x16b, res_temp2_8x16b, res_temp3_8x16b, res_temp4_8x16b, res_temp5_8x16b, res_temp6_8x16b, res_temp7_8x16b, res_temp8_8x16b;
    __m128i res_temp11_8x16b, res_temp12_8x16b, res_temp13_8x16b, res_temp14_8x16b, res_temp15_8x16b, res_temp16_8x16b, res_temp17_8x16b, res_temp18_8x16b;
    __m128i coeff0_1_8x16b, coeff2_3_8x16b, coeff4_5_8x16b, coeff6_7_8x16b;
    __m128i control_mask_1_8x16b, control_mask_2_8x16b, control_mask_3_8x16b, control_mask_4_8x16b;

    ASSERT(wd % 4 == 0); /* checking assumption*/

    PREFETCH((char const *)(pu1_src + (0 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (1 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (2 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (3 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (4 * src_strd)), _MM_HINT_T0)
    PREFETCH((char const *)(pu1_src + (5 * src_strd)), _MM_HINT_T0)

    /* load 8 8-bit coefficients and convert 8-bit into 16-bit  */
    src_temp1_16x8b = _mm_loadl_epi64((__m128i *)pi1_coeff);
    zero_8x16b = _mm_set1_epi32(0);
    offset_8x16b = _mm_set1_epi16(OFFSET_14_MINUS_BIT_DEPTH); /* for offset addition */

    mask_low_32b = _mm_cmpeq_epi16(zero_8x16b, zero_8x16b);
    mask_high_96b = _mm_srli_si128(mask_low_32b, 12);
    mask_low_32b = _mm_slli_si128(mask_low_32b, 4);

    control_mask_1_8x16b = _mm_set1_epi32(0x01000100); /* Control Mask register */
    control_mask_2_8x16b = _mm_set1_epi32(0x03020302); /* Control Mask register */
    control_mask_3_8x16b = _mm_set1_epi32(0x05040504); /* Control Mask register */
    control_mask_4_8x16b = _mm_set1_epi32(0x07060706); /* Control Mask register */

    coeff0_1_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_1_8x16b);  /* pi1_coeff[4] */
    coeff2_3_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_2_8x16b);  /* pi1_coeff[4] */

    coeff4_5_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_3_8x16b);  /* pi1_coeff[4] */
    coeff6_7_8x16b = _mm_shuffle_epi8(src_temp1_16x8b, control_mask_4_8x16b);  /* pi1_coeff[4] */

    if(0 == (ht & 1)) /* ht multiple of 2 case */
    {

        if(0 == (wd & 7)) /* wd = multiple of 8 case */
        {
            for(row = 0; row < ht; row += 2)
            {

                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 8)
                {
                    /*load 16 pixel values from row 0*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));         /* row = 0 */

                    /*load 16 pixel values from row 1*/
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row =1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row =1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row =1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 8; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* pointer updates*/
                pu1_dst += 2 * dst_strd;  /* pointer updates*/
            }
        }
        else /* wd = multiple of 4 case */
        {
            for(row = 0; row < ht; row += 2)
            {
                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));             /* row = 0 */
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row = 1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row = 1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    res_temp17_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                    res_temp18_8x16b =  _mm_and_si128(res_temp17_8x16b, mask_low_32b);
                    res_temp17_8x16b =  _mm_and_si128(res_temp15_8x16b, mask_high_96b);
                    res_temp15_8x16b = _mm_or_si128(res_temp17_8x16b, res_temp18_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 4; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* Pointer update */
                pu1_dst += 2 * dst_strd;  /* Pointer update */
            }
        }
    }
    else /* odd ht */
    {
        if(0 == (wd & 7)) /* multiple of 8 case */
        {
            for(row = 0; row < ht; row++)
            {
                int offset = 0;


                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 8)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));  /* row = 0 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    offset += 8; /* To pointer updates*/
                }
                pu1_src += src_strd;    /* pointer updates*/
                pu1_dst += dst_strd;    /* pointer updates*/
            }
        }
        else  /* wd = multiple of 4 case */
        {
            for(row = 0; row < (ht - 1); row += 2)
            {
                int offset = 0;

                PREFETCH((char const *)(pu1_src + (6 * src_strd)), _MM_HINT_T0)
                PREFETCH((char const *)(pu1_src + (7 * src_strd)), _MM_HINT_T0)


                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));             /* row = 0 */
                    src_temp11_16x8b = _mm_loadu_si128((__m128i *)(pu1_src + src_strd - 3 + offset)); /* row = 1 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    src_temp12_16x8b = _mm_srli_si128(src_temp11_16x8b, 1);                   /* row = 1 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/                 /* row = 1 */
                    src_temp13_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp11_8x16b = _mm_maddubs_epi16(src_temp13_16x8b, coeff0_1_8x16b);   /* row = 1 */
                                                                                              /* row = 1 */
                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp14_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp12_8x16b = _mm_maddubs_epi16(src_temp14_16x8b, coeff2_3_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp15_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp13_8x16b = _mm_maddubs_epi16(src_temp15_16x8b, coeff4_5_8x16b);   /* row = 1 */

                    src_temp11_16x8b = _mm_srli_si128(src_temp11_16x8b, 2);                   /* row = 1 */
                    src_temp12_16x8b = _mm_srli_si128(src_temp12_16x8b, 2);                   /* row = 1 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/                  /* row = 1 */
                    src_temp16_16x8b = _mm_unpacklo_epi8(src_temp11_16x8b, src_temp12_16x8b); /* row = 1 */
                    res_temp14_8x16b = _mm_maddubs_epi16(src_temp16_16x8b, coeff6_7_8x16b);   /* row = 1 */

                    res_temp15_8x16b = _mm_add_epi16(res_temp11_8x16b, res_temp12_8x16b);
                    res_temp16_8x16b = _mm_add_epi16(res_temp13_8x16b, res_temp14_8x16b);
                    res_temp15_8x16b = _mm_add_epi16(res_temp15_8x16b, res_temp16_8x16b);

                    res_temp16_8x16b = _mm_adds_epi16(res_temp15_8x16b, offset_8x16b);             /* row = 1 */
                    res_temp16_8x16b = _mm_srai_epi16(res_temp16_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 1 */
                    res_temp15_8x16b = _mm_packus_epi16(res_temp16_8x16b, res_temp16_8x16b);       /* row = 1 */

                    res_temp17_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + dst_strd + offset));
                    res_temp18_8x16b =  _mm_and_si128(res_temp17_8x16b, mask_low_32b);
                    res_temp17_8x16b =  _mm_and_si128(res_temp15_8x16b, mask_high_96b);
                    res_temp15_8x16b = _mm_or_si128(res_temp17_8x16b, res_temp18_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + dst_strd + offset), res_temp15_8x16b);

                    offset += 4; /* To pointer updates*/
                }
                pu1_src += 2 * src_strd;  /* Pointer update */
                pu1_dst += 2 * dst_strd;  /* Pointer update */
            }
            { /* last repeat at outside the loop */
                int offset = 0;
                for(col = 0; col < wd; col += 4)
                {
                    /*load 16 pixel values from 12:-3 pos. relative to cur. pos.*/
                    src_temp1_16x8b = _mm_loadu_si128((__m128i *)(pu1_src - 3 + offset));  /* row = 0 */

                    src_temp2_16x8b = _mm_srli_si128(src_temp1_16x8b, 1);                  /* row = 0 */
                    /* pix. |5:-2|4:-3| to do two dot-products at same time*/              /* row = 0 */
                    src_temp3_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp1_8x16b = _mm_maddubs_epi16(src_temp3_16x8b, coeff0_1_8x16b);  /* row = 0 */
                                                                                           /* row = 0 */
                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp4_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp2_8x16b = _mm_maddubs_epi16(src_temp4_16x8b, coeff2_3_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp5_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp3_8x16b = _mm_maddubs_epi16(src_temp5_16x8b, coeff4_5_8x16b);  /* row = 0 */

                    src_temp1_16x8b = _mm_srli_si128(src_temp1_16x8b, 2);                  /* row = 0 */
                    src_temp2_16x8b = _mm_srli_si128(src_temp2_16x8b, 2);                  /* row = 0 */
                    /* pix. |7:0|6:-1| to do two dot-products at same time*/               /* row = 0 */
                    src_temp6_16x8b = _mm_unpacklo_epi8(src_temp1_16x8b, src_temp2_16x8b); /* row = 0 */
                    res_temp4_8x16b = _mm_maddubs_epi16(src_temp6_16x8b, coeff6_7_8x16b);  /* row = 0 */

                    res_temp5_8x16b = _mm_add_epi16(res_temp1_8x16b, res_temp2_8x16b);
                    res_temp6_8x16b = _mm_add_epi16(res_temp3_8x16b, res_temp4_8x16b);
                    res_temp5_8x16b = _mm_add_epi16(res_temp5_8x16b, res_temp6_8x16b);

                    res_temp6_8x16b = _mm_adds_epi16(res_temp5_8x16b, offset_8x16b);             /* row = 0 */
                    res_temp6_8x16b = _mm_srai_epi16(res_temp6_8x16b, SHIFT_14_MINUS_BIT_DEPTH); /* row = 0 */
                    res_temp5_8x16b = _mm_packus_epi16(res_temp6_8x16b, res_temp6_8x16b);        /* row = 0 */

                    res_temp7_8x16b = _mm_loadl_epi64((__m128i *)(pu1_dst + offset));
                    res_temp8_8x16b =  _mm_and_si128(res_temp7_8x16b, mask_low_32b);
                    res_temp7_8x16b =  _mm_and_si128(res_temp5_8x16b, mask_high_96b);
                    res_temp5_8x16b = _mm_or_si128(res_temp7_8x16b, res_temp8_8x16b);

                    /* to store the 1st 4 pixels res. */
                    _mm_storel_epi64((__m128i *)(pu1_dst + offset), res_temp5_8x16b);

                    offset += 4; /* To pointer updates*/
                }
            }
        }
    }
}